

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseBuilder::onAttach(BaseBuilder *this,CodeHolder *code)

{
  BaseBuilder *in_RSI;
  long *in_RDI;
  Error err;
  SectionNode *initialSection;
  Error _err;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Error local_2c;
  
  local_2c = BaseEmitter::onAttach
                       (&in_RSI->super_BaseEmitter,
                        (CodeHolder *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
  ;
  if (local_2c == 0) {
    local_2c = sectionNodeOf(in_RSI,(SectionNode **)(ulong)in_stack_ffffffffffffffb8,
                             in_stack_ffffffffffffffb4);
    if (local_2c == 0) {
      local_2c = ZoneVector<asmjit::v1_14::Pass_*>::willGrow
                           ((ZoneVector<asmjit::v1_14::Pass_*> *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (ZoneAllocator *)(ulong)in_stack_ffffffffffffffa8,
                            (uint32_t)((ulong)in_RDI >> 0x20));
    }
    if (local_2c == 0) {
      in_RDI[0x33] = CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
      in_RDI[0x34] = CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
      in_RDI[0x35] = CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
      *(undefined1 *)(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0) + 0x11) = 0x80;
      local_2c = 0;
    }
    else {
      (**(code **)(*in_RDI + 0x88))(in_RDI,in_RSI);
    }
  }
  return local_2c;
}

Assistant:

Error BaseBuilder::onAttach(CodeHolder* code) noexcept {
  ASMJIT_PROPAGATE(Base::onAttach(code));

  SectionNode* initialSection;
  Error err = sectionNodeOf(&initialSection, 0);

  if (!err)
    err = _passes.willGrow(&_allocator, 8);

  if (ASMJIT_UNLIKELY(err)) {
    onDetach(code);
    return err;
  }

  ASMJIT_ASSUME(initialSection != nullptr);
  _cursor = initialSection;
  _nodeList.reset(initialSection, initialSection);
  initialSection->setFlags(NodeFlags::kIsActive);

  return kErrorOk;
}